

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O3

void __thiscall WorkItemScheduler::work_dispatch(WorkItemScheduler *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  ssize_t sVar5;
  mapped_type *pmVar6;
  system_error *this_00;
  error_category *peVar7;
  undefined4 uVar8;
  error_code __ec;
  error_code __ec_00;
  Events event;
  epoll_event local_40;
  
  uVar8 = 0;
  local_40.data.fd = 0;
  local_40.events = 0;
  local_40._4_4_ = 0;
  local_40.data.u64._4_4_ = 0;
LAB_00104042:
  bVar2 = false;
LAB_00104044:
  if ((this->active_ == false) &&
     ((this->work_).
      super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->work_).
      super__Deque_base<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>,_std::allocator<std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
    return;
  }
  if (!bVar2) {
    local_40.events = 0;
    local_40._4_4_ = 0;
    local_40.data.fd = 0;
    while (iVar3 = epoll_wait(this->epoll_fd_,&local_40,1,100), iVar3 == -1) {
      puVar4 = (uint *)__errno_location();
      if (*puVar4 != 4) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        uVar1 = *puVar4;
        peVar7 = (error_category *)std::_V2::generic_category();
        __ec._4_4_ = 0;
        __ec._M_value = uVar1;
        __ec._M_cat = peVar7;
        std::system_error::system_error(this_00,__ec,"Call to epoll_wait(2) failed");
        goto LAB_00104158;
      }
    }
    if (iVar3 == 0) goto LAB_00104042;
    while (sVar5 = read(local_40._4_4_,(void *)((long)&local_40.data + 4),4),
          uVar8 = local_40.data.u64._4_4_, (int)sVar5 == -1) {
      puVar4 = (uint *)__errno_location();
      if (*puVar4 != 4) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        uVar1 = *puVar4;
        peVar7 = (error_category *)std::_V2::generic_category();
        __ec_00._4_4_ = 0;
        __ec_00._M_value = uVar1;
        __ec_00._M_cat = peVar7;
        std::system_error::system_error(this_00,__ec_00,"Call to read(2) failed");
LAB_00104158:
        __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
      }
    }
  }
  bVar2 = false;
  if (uVar8 == 1) {
    pmVar6 = std::
             map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::operator[](&this->fd_worker_map_,(key_type *)&local_40.field_0x4);
    bVar2 = try_send_work(this,*pmVar6);
    bVar2 = !bVar2;
    uVar8 = 1;
  }
  goto LAB_00104044;
}

Assistant:

void WorkItemScheduler::work_dispatch()
{
    bool skip_polling = false;
    struct epoll_event ev = {0};
    Events event = Events::NONE;

    while (this->active_ || !this->work_.empty())
    {
        int rv = 0;

        if (!skip_polling)
        {
            ev = {0};
            do
            {
                rv = epoll_wait(this->epoll_fd_, &ev, 1, 100);
                if (rv == -1 && errno != EINTR)
                    throw SYS_ERROR(errno, "Call to epoll_wait(2) failed");
            } while (rv == -1);

            if (rv == 0)
                continue;

            do
            {
                rv = read(ev.data.fd, &event, sizeof(event));
                if (rv == -1 && errno != EINTR)
                    throw SYS_ERROR(errno, "Call to read(2) failed");
            } while (rv == -1);
        }

        switch (event)
        {
            case Events::WORK_REQ:
                skip_polling =
                    !this->try_send_work(this->fd_worker_map_[ev.data.fd]);
                break;
            default:
                skip_polling = false;
                break;
        }
    }
}